

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_9b2ac::copyFile(string *srcFn,string *cpyFn)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Header *pHVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar8;
  TiledOutputPart partout_3;
  TiledInputPart partin_3;
  OutputPart partout_2;
  InputPart partin_2;
  DeepTiledOutputPart partout_1;
  DeepTiledInputPart partin_1;
  DeepScanLineOutputPart partout;
  DeepScanLineInputPart partin;
  string part_type;
  int i_1;
  MultiPartOutputFile out;
  int i;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> in_hdr;
  MultiPartInputFile in;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *in_stack_fffffffffffffee0;
  TiledOutputPart local_c8 [8];
  TiledInputPart local_c0 [8];
  OutputPart local_b8 [8];
  InputPart local_b0 [8];
  DeepTiledOutputPart local_a8 [8];
  DeepTiledInputPart local_a0 [8];
  DeepScanLineOutputPart local_98 [8];
  DeepScanLineInputPart local_90 [8];
  string local_88 [36];
  int local_64;
  MultiPartOutputFile local_60 [20];
  int local_4c;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_38;
  MultiPartInputFile local_20 [32];
  
  std::operator<<((ostream *)&std::cout,"copying ");
  std::ostream::flush();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_20,pcVar5,iVar2,true);
  Imf_3_2::MultiPartInputFile::parts();
  std::allocator<Imf_3_2::Header>::allocator((allocator<Imf_3_2::Header> *)0x175d1b);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            (in_stack_fffffffffffffee0,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::allocator<Imf_3_2::Header>::~allocator((allocator<Imf_3_2::Header> *)0x175d41);
  for (local_4c = 0; iVar2 = local_4c, iVar3 = Imf_3_2::MultiPartInputFile::parts(), iVar2 < iVar3;
      local_4c = local_4c + 1) {
    pHVar6 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_20);
    pvVar7 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
                       (&local_38,(long)local_4c);
    Imf_3_2::Header::operator=(pvVar7,pHVar6);
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::c_str();
  pvVar7 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_38,0);
  iVar2 = Imf_3_2::MultiPartInputFile::parts();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile(local_60,(char *)__lhs,pvVar7,iVar2,false,iVar3)
  ;
  local_64 = 0;
  while (iVar2 = local_64, iVar4 = Imf_3_2::MultiPartInputFile::parts(), iVar2 < iVar4) {
    Imf_3_2::MultiPartInputFile::header((int)local_20);
    psVar8 = (string *)Imf_3_2::Header::type_abi_cxx11_();
    std::__cxx11::string::string(local_88,psVar8);
    _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(iVar3,iVar4));
    if (_Var1) {
      Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart(local_90,local_20,local_64);
      Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart(local_98,local_60,local_64);
      Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_98);
    }
    else {
      _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(iVar3,iVar4));
      if (_Var1) {
        Imf_3_2::DeepTiledInputPart::DeepTiledInputPart(local_a0,local_20,local_64);
        Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart(local_a8,local_60,local_64);
        Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_a8);
      }
      else {
        _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(iVar3,iVar4));
        if (_Var1) {
          Imf_3_2::InputPart::InputPart(local_b0,local_20,local_64);
          Imf_3_2::OutputPart::OutputPart(local_b8,local_60,local_64);
          Imf_3_2::OutputPart::copyPixels((InputPart *)local_b8);
        }
        else {
          _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(iVar3,iVar4));
          if (_Var1) {
            Imf_3_2::TiledInputPart::TiledInputPart(local_c0,local_20,local_64);
            Imf_3_2::TiledOutputPart::TiledOutputPart(local_c8,local_60,local_64);
            Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)local_c8);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_88);
    local_64 = local_64 + 1;
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(local_60);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
             CONCAT44(iVar2,in_stack_fffffffffffffed0));
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_20);
  return;
}

Assistant:

void
copyFile (const std::string& srcFn, const std::string& cpyFn)
{
    cout << "copying ";
    cout.flush ();
    {
        DeepTiledInputFile in_file (srcFn.c_str (), 8);
        remove (cpyFn.c_str ());
        DeepTiledOutputFile out_file (cpyFn.c_str (), in_file.header ());
        out_file.copyPixels (in_file);
    }
    // prevent accidentally reading source instead of copy
    remove (srcFn.c_str ());
}